

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_time.c
# Opt level: O2

int amqp_time_tv_until(amqp_time_t time,timeval *in,timeval **out)

{
  undefined1 auVar1 [16];
  uint64_t uVar2;
  ulong uVar3;
  
  if (time.time_point_ns == 0xffffffffffffffff) {
    in = (timeval *)0x0;
  }
  else {
    if (time.time_point_ns != 0) {
      uVar2 = amqp_get_monotonic_timestamp();
      if (uVar2 == 0) {
        return -0xe;
      }
      uVar3 = time.time_point_ns - uVar2;
      if (uVar2 <= time.time_point_ns && uVar3 != 0) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar3;
        in->tv_sec = (long)SUB164(auVar1 / ZEXT816(1000000000),0);
        in->tv_usec = (uVar3 % 1000000000) / 1000;
        goto LAB_0010a7fa;
      }
    }
    in->tv_sec = 0;
    in->tv_usec = 0;
  }
LAB_0010a7fa:
  *out = in;
  return 0;
}

Assistant:

int amqp_time_tv_until(amqp_time_t time, struct timeval *in,
                       struct timeval **out) {
  uint64_t now_ns;
  uint64_t delta_ns;

  assert(in != NULL);
  if (UINT64_MAX == time.time_point_ns) {
    *out = NULL;
    return AMQP_STATUS_OK;
  }
  if (0 == time.time_point_ns) {
    in->tv_sec = 0;
    in->tv_usec = 0;
    *out = in;
    return AMQP_STATUS_OK;
  }

  now_ns = amqp_get_monotonic_timestamp();
  if (0 == now_ns) {
    return AMQP_STATUS_TIMER_FAILURE;
  }

  if (now_ns >= time.time_point_ns) {
    in->tv_sec = 0;
    in->tv_usec = 0;
    *out = in;
    return AMQP_STATUS_OK;
  }

  delta_ns = time.time_point_ns - now_ns;
  in->tv_sec = (int)(delta_ns / AMQP_NS_PER_S);
  in->tv_usec = (int)((delta_ns % AMQP_NS_PER_S) / AMQP_NS_PER_US);
  *out = in;

  return AMQP_STATUS_OK;
}